

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::NotEqualTest<short,unsigned_int>(void)

{
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_36;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_34;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_32;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_30;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2e;
  int local_2c [3];
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_20;
  int local_1c [3];
  
  local_1c[2] = 3;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_2e,local_1c + 2);
  if (local_2e.m_int != 2) {
    local_1c[1] = 4;
    SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              (&local_30,local_1c + 1);
    if (local_30.m_int != 5) {
      local_1c[0] = 6;
      SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_32,local_1c);
      local_2c[2] = 7;
      SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_20,local_2c + 2);
      if ((long)local_32.m_int != (ulong)local_20.m_int) {
        local_2c[1] = 1;
        SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                  (&local_34,local_2c + 1);
        if (local_34.m_int == 0) {
          local_2c[0] = 0;
          SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                    (&local_36,local_2c);
          return local_36.m_int != 0;
        }
      }
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool NotEqualTest()
	{
		return
			(U)2 != SafeInt<T>(3) &&
			SafeInt<T>(4) != (U)5 &&
			SafeInt<T>(6) != SafeInt<U>(7) &&
			true != SafeInt<T>(1) &&
			false != SafeInt<T>(0);
	}